

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2polygon.cc
# Opt level: O0

void __thiscall
S2Polygon::InitToOperation
          (S2Polygon *this,OpType op_type,SnapFunction *snap_function,S2Polygon *a,S2Polygon *b)

{
  bool bVar1;
  ostream *poVar2;
  char *pcVar3;
  S2LogMessage local_78 [2];
  undefined1 local_58 [8];
  S2Error error;
  S2Polygon *b_local;
  S2Polygon *a_local;
  SnapFunction *snap_function_local;
  OpType op_type_local;
  S2Polygon *this_local;
  
  error._32_8_ = b;
  S2Error::S2Error((S2Error *)local_58);
  bVar1 = InitToOperation(this,op_type,snap_function,a,(S2Polygon *)error._32_8_,(S2Error *)local_58
                         );
  if (!bVar1) {
    S2FatalLogMessage::S2FatalLogMessage
              ((S2FatalLogMessage *)local_78,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2polygon.cc"
               ,0x372,kFatal,(ostream *)&std::cerr);
    poVar2 = S2LogMessage::stream(local_78);
    pcVar3 = S2BooleanOperation::OpTypeToString(op_type);
    poVar2 = std::operator<<(poVar2,pcVar3);
    poVar2 = std::operator<<(poVar2," operation failed: ");
    ::operator<<(poVar2,(S2Error *)local_58);
    S2FatalLogMessage::~S2FatalLogMessage((S2FatalLogMessage *)local_78);
  }
  S2Error::~S2Error((S2Error *)local_58);
  return;
}

Assistant:

void S2Polygon::InitToOperation(S2BooleanOperation::OpType op_type,
                                const S2Builder::SnapFunction& snap_function,
                                const S2Polygon& a, const S2Polygon& b) {
  S2Error error;
  if (!InitToOperation(op_type, snap_function, a, b, &error)) {
    S2_LOG(DFATAL) << S2BooleanOperation::OpTypeToString(op_type)
                << " operation failed: " << error;
  }
}